

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parents.h
# Opt level: O1

void __thiscall wasm::Parents::Parents(Parents *this,Expression *expr)

{
  Expression *local_20;
  Expression *expr_local;
  
  (this->inner).
  super_ExpressionStackWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
  .
  super_PostWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
  .super_Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>.
  replacep = (Expression **)0x0;
  (this->inner).
  super_ExpressionStackWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
  .
  super_PostWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
  .super_Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>.
  stack.usedFixed = 0;
  (this->inner).
  super_ExpressionStackWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
  .expressionStack.flexible.
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->inner).
           super_ExpressionStackWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
           .expressionStack.flexible.
           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->inner).
           super_ExpressionStackWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
           .expressionStack.flexible.
           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->inner).
  super_ExpressionStackWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
  .
  super_PostWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
  .super_Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>.
  stack.flexible.
  super__Vector_base<wasm::Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->inner).
           super_ExpressionStackWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
           .
           super_PostWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
           .
           super_Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>::Task>_>
   + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->inner).
           super_ExpressionStackWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
           .
           super_PostWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
           .
           super_Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>::Task>_>
   + 0x10) = (pointer)0x0;
  (this->inner).
  super_ExpressionStackWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
  .
  super_PostWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
  .super_Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>.
  currFunction = (Function *)0x0;
  (this->inner).
  super_ExpressionStackWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
  .
  super_PostWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
  .super_Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>.
  currModule = (Module *)0x0;
  (this->inner).
  super_ExpressionStackWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
  .expressionStack.usedFixed = 0;
  (this->inner).parentMap._M_h._M_buckets = &(this->inner).parentMap._M_h._M_single_bucket;
  (this->inner).parentMap._M_h._M_bucket_count = 1;
  (this->inner).parentMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->inner).parentMap._M_h._M_element_count = 0;
  (this->inner).parentMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->inner).parentMap._M_h._M_rehash_policy._M_next_resize = 0;
  (this->inner).parentMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_20 = expr;
  Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>::walk
            ((Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
              *)this,&local_20);
  return;
}

Assistant:

Parents(Expression* expr) { inner.walk(expr); }